

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_SubDDisplayParameters *
ON_SubDDisplayParameters::DecodeFromUnsignedChar
          (ON_SubDDisplayParameters *__return_storage_ptr__,uchar encoded_parameters)

{
  uchar uVar1;
  unsigned_short uVar2;
  bool bVar3;
  Context CVar4;
  bool bVar5;
  uchar uVar6;
  undefined8 uVar7;
  uint uVar8;
  ON__UINT_PTR OVar9;
  double dVar10;
  ON_Terminator *pOVar11;
  ON_ProgressReporter *pOVar12;
  double dVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  
  dVar13 = Default.m_progress_reporter_interval.m_t[1];
  pOVar12 = Default.m_progress_reporter;
  pOVar11 = Default.m_terminator;
  dVar10 = Default.m_reserved7;
  OVar9 = Default.m_reserved6;
  uVar7 = Default._8_8_;
  uVar15 = Default._0_8_;
  (__return_storage_ptr__->m_progress_reporter_interval).m_t[0] =
       Default.m_progress_reporter_interval.m_t[0];
  (__return_storage_ptr__->m_progress_reporter_interval).m_t[1] = dVar13;
  __return_storage_ptr__->m_terminator = pOVar11;
  __return_storage_ptr__->m_progress_reporter = pOVar12;
  __return_storage_ptr__->m_reserved6 = OVar9;
  __return_storage_ptr__->m_reserved7 = dVar10;
  uVar14 = Default._0_8_;
  Default.m_bDisplayDensityIsAbsolute = SUB81(uVar15,0);
  Default.m_display_density = SUB81(uVar15,1);
  uVar1 = Default.m_display_density;
  Default.m_reserved = SUB82(uVar15,2);
  uVar2 = Default.m_reserved;
  Default.m_bControlNetMesh = SUB81(uVar15,4);
  bVar3 = Default.m_bControlNetMesh;
  Default.m_context = SUB81(uVar15,5);
  CVar4 = Default.m_context;
  Default.m_bComputeCurvature = SUB81(uVar15,6);
  bVar5 = Default.m_bComputeCurvature;
  Default.m_reserved3 = SUB81(uVar15,7);
  uVar6 = Default.m_reserved3;
  __return_storage_ptr__->m_bDisplayDensityIsAbsolute = Default.m_bDisplayDensityIsAbsolute;
  Default._0_8_ = uVar14;
  uVar15 = Default._8_8_;
  __return_storage_ptr__->m_display_density = uVar1;
  __return_storage_ptr__->m_reserved = uVar2;
  __return_storage_ptr__->m_bControlNetMesh = bVar3;
  __return_storage_ptr__->m_context = CVar4;
  __return_storage_ptr__->m_bComputeCurvature = bVar5;
  __return_storage_ptr__->m_reserved3 = uVar6;
  Default.m_reserved4 = (uint)uVar7;
  Default.m_reserved5 = SUB84(uVar7,4);
  uVar8 = Default.m_reserved5;
  __return_storage_ptr__->m_reserved4 = Default.m_reserved4;
  Default._8_8_ = uVar15;
  __return_storage_ptr__->m_reserved5 = uVar8;
  if (-1 < (char)encoded_parameters) {
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->m_bDisplayDensityIsAbsolute = (bool)(encoded_parameters >> 4 & 1);
  __return_storage_ptr__->m_display_density = encoded_parameters & 7;
  if ((encoded_parameters & 8) != 0) {
    __return_storage_ptr__->m_bControlNetMesh = true;
  }
  __return_storage_ptr__->m_bComputeCurvature = (bool)(encoded_parameters >> 5 & 1);
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDDisplayParameters ON_SubDDisplayParameters::DecodeFromUnsignedChar(
  unsigned char encoded_parameters
)
{
  ON_SubDDisplayParameters p(ON_SubDDisplayParameters::Default);

  if (0 != (ON_SubDDisplayParameters::subd_mesh_nondefault_bit & encoded_parameters))
  {
    const unsigned char density_is_absolute = (ON_SubDDisplayParameters::subd_mesh_absolute_density_bit & encoded_parameters);
    const unsigned char density_as_char = (ON_SubDDisplayParameters::subd_mesh_density_mask & encoded_parameters);
    const unsigned char location_ctrl_net = (ON_SubDDisplayParameters::subd_mesh_location_bit & encoded_parameters);
    const unsigned char compute_curvature = (ON_SubDDisplayParameters::subd_mesh_compute_curvature_bit & encoded_parameters);
    p.m_bDisplayDensityIsAbsolute = (0 != density_is_absolute) ? true : false;
    p.m_display_density = density_as_char;
    if (0 != location_ctrl_net)
      p.SetMeshLocation(ON_SubDComponentLocation::ControlNet);
    p.SetComputeCurvature(0 != compute_curvature);
  }

  return p;
}